

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_empower(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  CHAR_DATA *ch_00;
  char *__format;
  char arg2 [4608];
  char buf [4608];
  char arg [4608];
  char local_3618 [4608];
  char local_2418 [4608];
  char local_1218 [4608];
  
  pcVar2 = one_argument(argument,local_1218);
  one_argument(pcVar2,local_3618);
  if ((local_1218[0] != '\0') && (local_3618[0] != '\0')) {
    bVar1 = is_switched(ch);
    if (bVar1) {
      pcVar2 = "You can\'t do that while switched!\n\r";
      goto LAB_00276d0c;
    }
    ch_00 = get_char_world(ch,local_1218);
    if ((ch_00 == (CHAR_DATA *)0x0) || (bVar1 = is_npc(ch_00), bVar1)) {
      pcVar2 = "They aren\'t here.\n\r";
      goto LAB_00276d0c;
    }
    bVar1 = str_prefix(local_3618,"no");
    if (!bVar1) {
      if (((uint)ch_00->act[0] >> 0xe & 1) != 0) {
        ch_00->act[0] = ch_00->act[0] & 0xffffffffffffbfff;
        send_to_char("The Immortals have revoked your empowerment!\n\r",ch_00);
        act("You have UNEMPOWERED $N, until you notify $M, $E doesn\'t know.",ch,(void *)0x0,ch_00,3
           );
        sprintf(local_2418,"$N revokes %s\'s empowerment.",ch_00->name);
        wiznet(local_2418,ch,(OBJ_DATA *)0x0,9,0,0);
        pcVar2 = ch->true_name;
        __format = "AUTO: Unempowered by %s.\n\r";
LAB_00276e37:
        sprintf(local_2418,__format,pcVar2);
        add_history((CHAR_DATA *)0x0,ch_00,local_2418);
        return;
      }
      pcVar2 = "They are not empowered in the first place.\n\r";
      goto LAB_00276d0c;
    }
    bVar1 = str_prefix(local_3618,"yes");
    if (!bVar1) {
      if (((uint)ch_00->act[0] >> 0xe & 1) == 0) {
        ch_00->act[0] = ch_00->act[0] | 0x4000;
        act("You have EMPOWERED $N, until you notify $M, $E doesn\'t know.",ch,(void *)0x0,ch_00,3);
        sprintf(local_2418,"$N empowers %s.",ch_00->name);
        wiznet(local_2418,ch,(OBJ_DATA *)0x0,9,0,0);
        pcVar2 = ch->true_name;
        __format = "AUTO: Empowered by %s.\n\r";
        goto LAB_00276e37;
      }
      pcVar2 = "They are already empowered.\n\r";
      goto LAB_00276d0c;
    }
  }
  pcVar2 = "Syntax: empower <char> <yes/no>\n\r";
LAB_00276d0c:
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_empower(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_STRING_LENGTH];
	char arg2[MAX_STRING_LENGTH];
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg);
	argument = one_argument(argument, arg2);

	if (arg[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax: empower <char> <yes/no>\n\r", ch);
		return;
	}

	if (is_switched(ch))
	{
		send_to_char("You can't do that while switched!\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr || is_npc(victim))
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "no"))
	{
		if (IS_SET(victim->act, PLR_EMPOWERED))
		{
			REMOVE_BIT(victim->act, PLR_EMPOWERED);

			send_to_char("The Immortals have revoked your empowerment!\n\r", victim);
			act("You have UNEMPOWERED $N, until you notify $M, $E doesn't know.", ch, 0, victim, TO_CHAR);

			sprintf(buf, "$N revokes %s's empowerment.", victim->name);
			wiznet(buf, ch, nullptr, WIZ_PENALTIES, 0, 0);

			sprintf(buf, "AUTO: Unempowered by %s.\n\r", ch->true_name);
			add_history(nullptr, victim, buf);

			return;
		}
		else
		{
			send_to_char("They are not empowered in the first place.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg2, "yes"))
	{
		if (!IS_SET(victim->act, PLR_EMPOWERED))
		{
			SET_BIT(victim->act, PLR_EMPOWERED);

			act("You have EMPOWERED $N, until you notify $M, $E doesn't know.", ch, 0, victim, TO_CHAR);

			sprintf(buf, "$N empowers %s.", victim->name);
			wiznet(buf, ch, nullptr, WIZ_PENALTIES, 0, 0);

			sprintf(buf, "AUTO: Empowered by %s.\n\r", ch->true_name);
			add_history(nullptr, victim, buf);

			return;
		}
		else
		{
			send_to_char("They are already empowered.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("Syntax: empower <char> <yes/no>\n\r", ch);
		return;
	}
}